

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.h
# Opt level: O0

int32_t GetTransactionWeight(CTransaction *tx)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  CTransaction *in_RDI;
  long in_FS_OFFSET;
  TransactionSerParams *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  TransactionSerParams::operator()(in_stack_ffffffffffffffd8,in_RDI);
  sVar2 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)in_RDI);
  TransactionSerParams::operator()(in_stack_ffffffffffffffd8,in_RDI);
  sVar3 = GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction_const>>
                    ((ParamsWrapper<TransactionSerParams,_const_CTransaction> *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)sVar2 * 3 + (int)sVar3;
  }
  __stack_chk_fail();
}

Assistant:

static inline int32_t GetTransactionWeight(const CTransaction& tx)
{
    return ::GetSerializeSize(TX_NO_WITNESS(tx)) * (WITNESS_SCALE_FACTOR - 1) + ::GetSerializeSize(TX_WITH_WITNESS(tx));
}